

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<anurbs::BrepFace,_std::shared_ptr<anurbs::BrepFace>_> * __thiscall
pybind11::class_<anurbs::BrepFace,std::shared_ptr<anurbs::BrepFace>>::
def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepLoop>,std::allocator<anurbs::Ref<anurbs::BrepLoop>>>(anurbs::BrepFace::*)()const>
          (class_<anurbs::BrepFace,std::shared_ptr<anurbs::BrepFace>> *this,char *name,
          offset_in_Model_to_subr *fget)

{
  class_<anurbs::BrepFace,_std::shared_ptr<anurbs::BrepFace>_> *pcVar1;
  return_value_policy local_29;
  cpp_function local_28;
  void *local_20;
  
  cpp_function::
  cpp_function<std::vector<anurbs::Ref<anurbs::BrepLoop>,std::allocator<anurbs::Ref<anurbs::BrepLoop>>>,anurbs::BrepFace>
            (&local_28,*fget);
  local_29 = reference_internal;
  local_20 = (void *)0x0;
  pcVar1 = def_property<pybind11::cpp_function,decltype(nullptr),pybind11::return_value_policy>
                     (this,name,&local_28,&local_20,&local_29);
  object::~object((object *)&local_28);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }